

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void ga_debug_suspend(void)

{
  return;
}

Assistant:

void ga_debug_suspend()
{
#if HAVE_PAUSE
   fprintf(stdout,"ga_debug: process %ld ready for debugging\n",
           (long)getpid());
   fflush(stdout);
   pause();
#endif
}